

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void __thiscall llvm::APInt::AssignSlowCase(APInt *this,APInt *RHS)

{
  uint64_t *__dest;
  uint64_t *__src;
  bool bVar1;
  uint uVar2;
  APInt *RHS_local;
  APInt *this_local;
  
  if (this != RHS) {
    uVar2 = getBitWidth(RHS);
    reallocate(this,uVar2);
    bVar1 = isSingleWord(this);
    if (bVar1) {
      this->U = RHS->U;
    }
    else {
      __dest = (this->U).pVal;
      __src = (RHS->U).pVal;
      uVar2 = getNumWords(this);
      memcpy(__dest,__src,(ulong)(uVar2 << 3));
    }
  }
  return;
}

Assistant:

void APInt::AssignSlowCase(const APInt& RHS) {
  // Don't do anything for X = X
  if (this == &RHS)
    return;

  // Adjust the bit width and handle allocations as necessary.
  reallocate(RHS.getBitWidth());

  // Copy the data.
  if (isSingleWord())
    U.VAL = RHS.U.VAL;
  else
    memcpy(U.pVal, RHS.U.pVal, getNumWords() * APINT_WORD_SIZE);
}